

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_layout.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  tst_layoutnode_properties();
  tst_layoutnode_horizontal_grid();
  tst_layoutnode_vertical_grid();
  tst_layoutnode_horizontal_flow();
  tst_layoutnode_vertical_flow();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    tst_layoutnode_properties();
    tst_layoutnode_horizontal_grid();
    tst_layoutnode_vertical_grid();
    tst_layoutnode_horizontal_flow();
    tst_layoutnode_vertical_flow();

    return 0;
}